

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::FeatureDescription::MergeFrom
          (FeatureDescription *this,FeatureDescription *from)

{
  ulong uVar1;
  LogMessage *other;
  FeatureType *pFVar2;
  undefined8 *puVar3;
  ulong uVar4;
  undefined1 *from_00;
  Arena *arena;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O1/mlmodel/format/Model.pb.cc"
               ,0x3fa);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  uVar4 = (ulong)(from->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe;
  if (*(long *)(uVar4 + 8) != 0) {
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar3 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar3 = (undefined8 *)*puVar3;
    }
    google::protobuf::internal::ArenaStringPtr::Set(&this->name_,uVar4,puVar3);
  }
  uVar4 = (ulong)(from->shortdescription_).tagged_ptr_.ptr_ & 0xfffffffffffffffe;
  if (*(long *)(uVar4 + 8) != 0) {
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar3 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar3 = (undefined8 *)*puVar3;
    }
    google::protobuf::internal::ArenaStringPtr::Set(&this->shortdescription_,uVar4,puVar3);
  }
  if ((from != (FeatureDescription *)_FeatureDescription_default_instance_) &&
     (from->type_ != (FeatureType *)0x0)) {
    if (this->type_ == (FeatureType *)0x0) {
      uVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
      arena = (Arena *)(uVar4 & 0xfffffffffffffffc);
      if ((uVar4 & 1) != 0) {
        arena = *(Arena **)arena;
      }
      pFVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                         (arena);
      this->type_ = pFVar2;
    }
    from_00 = (undefined1 *)from->type_;
    if ((FeatureType *)from_00 == (FeatureType *)0x0) {
      from_00 = _FeatureType_default_instance_;
    }
    FeatureType::MergeFrom(this->type_,(FeatureType *)from_00);
  }
  uVar4 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar4 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar4 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

void FeatureDescription::MergeFrom(const FeatureDescription& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.FeatureDescription)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  if (!from._internal_name().empty()) {
    _internal_set_name(from._internal_name());
  }
  if (!from._internal_shortdescription().empty()) {
    _internal_set_shortdescription(from._internal_shortdescription());
  }
  if (from._internal_has_type()) {
    _internal_mutable_type()->::CoreML::Specification::FeatureType::MergeFrom(from._internal_type());
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}